

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLRSA.cpp
# Opt level: O1

int __thiscall
OSSLRSA::decrypt(OSSLRSA *this,EVP_PKEY_CTX *ctx,uchar *out,size_t *outlen,uchar *in,size_t inlen)

{
  char cVar1;
  int iVar2;
  int iVar3;
  RSA *rsa;
  size_t sVar4;
  uchar *from;
  uchar *to;
  ulong uVar5;
  char *format;
  
  cVar1 = (**(code **)(*(long *)ctx + 0x18))(ctx,OSSLRSAPrivateKey::type);
  if (cVar1 == '\0') {
    format = "Invalid key type supplied";
    iVar2 = 0x50a;
  }
  else {
    rsa = (RSA *)OSSLRSAPrivateKey::getOSSLKey((OSSLRSAPrivateKey *)ctx);
    sVar4 = ByteString::size((ByteString *)out);
    iVar2 = RSA_size(rsa);
    if (sVar4 == (long)iVar2) {
      iVar2 = (int)in;
      if (iVar2 == 1) {
        iVar2 = 3;
      }
      else if (iVar2 == 3) {
        iVar2 = 1;
      }
      else {
        if (iVar2 != 4) {
          softHSMLog(3,"decrypt",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
                     ,0x529,"Invalid padding mechanism supplied (%i)",(ulong)in & 0xffffffff);
          return 0;
        }
        iVar2 = 4;
      }
      iVar3 = RSA_size(rsa);
      ByteString::resize((ByteString *)outlen,(long)iVar3);
      sVar4 = ByteString::size((ByteString *)out);
      from = ByteString::const_byte_str((ByteString *)out);
      to = ByteString::operator[]((ByteString *)outlen,0);
      iVar2 = RSA_private_decrypt((int)sVar4,from,to,rsa,iVar2);
      if (iVar2 != -1) {
        ByteString::resize((ByteString *)outlen,(long)iVar2);
        return (int)CONCAT71((int7)((ulong)outlen >> 8),1);
      }
      uVar5 = ERR_get_error();
      softHSMLog(3,"decrypt",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
                 ,0x534,"RSA private key decryption failed (0x%08X)",uVar5);
      return 0;
    }
    format = "Invalid amount of input data supplied for RSA decryption";
    iVar2 = 0x515;
  }
  softHSMLog(3,"decrypt",
             "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
             ,iVar2,format);
  return 0;
}

Assistant:

bool OSSLRSA::decrypt(PrivateKey* privateKey, const ByteString& encryptedData,
		      ByteString& data, const AsymMech::Type padding)
{
	// Check if the private key is the right type
	if (!privateKey->isOfType(OSSLRSAPrivateKey::type))
	{
		ERROR_MSG("Invalid key type supplied");

		return false;
	}

	// Retrieve the OpenSSL key object
	RSA* rsa = ((OSSLRSAPrivateKey*) privateKey)->getOSSLKey();

	// Check the input size
	if (encryptedData.size() != (size_t) RSA_size(rsa))
	{
		ERROR_MSG("Invalid amount of input data supplied for RSA decryption");

		return false;
	}

	// Determine the OpenSSL padding algorithm
	int osslPadding = 0;

	switch (padding)
	{
		case AsymMech::RSA_PKCS:
			osslPadding = RSA_PKCS1_PADDING;
			break;
		case AsymMech::RSA_PKCS_OAEP:
			osslPadding = RSA_PKCS1_OAEP_PADDING;
			break;
		case AsymMech::RSA:
			osslPadding = RSA_NO_PADDING;
			break;
		default:
			ERROR_MSG("Invalid padding mechanism supplied (%i)", padding);
			return false;
	}

	// Perform the RSA operation
	data.resize(RSA_size(rsa));

	int decSize = RSA_private_decrypt(encryptedData.size(), (unsigned char*) encryptedData.const_byte_str(), &data[0], rsa, osslPadding);

	if (decSize == -1)
	{
		ERROR_MSG("RSA private key decryption failed (0x%08X)", ERR_get_error());

		return false;
	}

	data.resize(decSize);

	return true;
}